

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall higan::TcpConnection::DestroyConnection(TcpConnection *this)

{
  LogLevel LVar1;
  Logger local_328;
  Fmt local_110;
  
  if (this->connecting_ == true) {
    this->connecting_ = false;
    Channel::DisableAll(&this->channel_);
    LVar1 = Logger::GetLogLevel();
    if ((int)LVar1 < 2) {
      Logger::Logger(&local_328,INFO,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpConnection.cpp"
                     ,0xbf,"DestroyConnection");
      Fmt::Fmt(&local_110,"connection: %s closed",(this->connection_name_)._M_dataplus._M_p);
      Logger::operator<<(&local_328,&local_110);
      Logger::~Logger(&local_328);
    }
  }
  return;
}

Assistant:

void TcpConnection::DestroyConnection()
{
	if (connecting_)
	{
		connecting_ = false;
		channel_.DisableAll();
		LOG_INFO << higan::Fmt("connection: %s closed", connection_name_.c_str());
	}
}